

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void calculate_func_cfg_live_info(gen_ctx_t gen_ctx,int freq_p)

{
  int freq_p_local;
  gen_ctx_t gen_ctx_local;
  
  gen_ctx->lr_ctx->ssa_live_info_p = 0;
  initiate_live_info(gen_ctx,freq_p);
  solve_dataflow(gen_ctx,0,live_con_func_0,live_con_func_n,live_trans_func);
  if (gen_ctx->optimize_level != 0) {
    update_bb_pressure(gen_ctx);
  }
  return;
}

Assistant:

static void calculate_func_cfg_live_info (gen_ctx_t gen_ctx, int freq_p) {
  ssa_live_info_p = FALSE;
  initiate_live_info (gen_ctx, freq_p);
  solve_dataflow (gen_ctx, FALSE, live_con_func_0, live_con_func_n, live_trans_func);
  if (optimize_level != 0) update_bb_pressure (gen_ctx);
}